

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_setnativeclosuredocstring(HSQUIRRELVM v,SQInteger idx,SQChar *docstring)

{
  HSQUIRRELVM v_00;
  SQObjectPtr *pSVar1;
  SQSharedState *in_RDX;
  SQNativeClosure *nc;
  SQObject o;
  SQChar *in_stack_ffffffffffffffc8;
  HSQUIRRELVM in_stack_ffffffffffffffd0;
  SQString *x;
  SQRESULT local_8;
  
  pSVar1 = stack_get(in_stack_ffffffffffffffd0,(SQInteger)in_stack_ffffffffffffffc8);
  v_00 = *(HSQUIRRELVM *)&pSVar1->super_SQObject;
  x = (pSVar1->super_SQObject)._unVal.pString;
  if ((int)v_00 == 0x8000200) {
    SQString::Create(in_RDX,(SQChar *)x,(SQInteger)v_00);
    SQObjectPtr::operator=((SQObjectPtr *)in_RDX,x);
    local_8 = 0;
  }
  else {
    local_8 = sq_throwerror(v_00,in_stack_ffffffffffffffc8);
  }
  return local_8;
}

Assistant:

SQRESULT sq_setnativeclosuredocstring(HSQUIRRELVM v,SQInteger idx,const SQChar *docstring)
{
    SQObject o = stack_get(v, idx);
    if(sq_isnativeclosure(o)) {
        SQNativeClosure *nc = _nativeclosure(o);
        nc->_docstring = SQString::Create(_ss(v), docstring);
        return SQ_OK;
    }
    return sq_throwerror(v,_SC("the object is not a nativeclosure"));
}